

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::SetPSKc
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aPSKc)

{
  ErrorCode EVar1;
  int iVar2;
  char *pcVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  ActiveOperationalDataset activeDataset;
  string local_188;
  undefined1 local_168 [8];
  char *local_160;
  size_t local_158;
  char local_150 [8];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  parse_func local_140 [1];
  ErrorCode local_130;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  ActiveOperationalDataset local_108;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  ActiveOperationalDataset::ActiveOperationalDataset(&local_108);
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_168._0_4_ = none_type;
    local_160 = "the commissioner is not active";
    local_158 = 0x1e;
    local_150 = (char  [8])0x0;
    local_140[0] = (parse_func)0x0;
    begin = "the commissioner is not active";
    local_148 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_168;
    do {
      pcVar3 = begin + 1;
      if (*begin == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_168);
      }
      begin = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_168;
    ::fmt::v10::vformat_abi_cxx11_(&local_188,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args);
    local_130 = kInvalidState;
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    __return_storage_ptr__->mCode = local_130;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_128)
    ;
    if (local_128[0] != local_118) {
      operator_delete(local_128[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108.mPSKc,aPSKc);
    local_108.mPresentFlags._0_1_ = (byte)local_108.mPresentFlags | 0x80;
    (*((this->mCommissioner).
       super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Commissioner[0x1e])(local_168);
    __return_storage_ptr__->mCode = local_168._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_160);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_160 != local_150) {
      operator_delete(local_160);
    }
    if (EVar1 == kNone) {
      MergeDataset(&this->mActiveDataset,&local_108);
    }
  }
  if (local_108.mSecurityPolicy.mFlags.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mSecurityPolicy.mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mPSKc.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mNetworkMasterKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mNetworkMasterKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.mMeshLocalPrefix.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mMeshLocalPrefix.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_108.mChannelMask);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.mNetworkName._M_dataplus._M_p != &local_108.mNetworkName.field_2) {
    operator_delete(local_108.mNetworkName._M_dataplus._M_p);
  }
  if (local_108.mExtendedPanId.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.mExtendedPanId.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetPSKc(const ByteArray &aPSKc)
{
    Error                    error;
    ActiveOperationalDataset activeDataset;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    activeDataset.mPSKc = aPSKc;
    activeDataset.mPresentFlags |= ActiveOperationalDataset::kPSKcBit;

    SuccessOrExit(error = mCommissioner->SetActiveDataset(activeDataset));

    MergeDataset(mActiveDataset, activeDataset);

exit:
    return error;
}